

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server::_doflagrun(clientinfo *ci,int timeused)

{
  char *__s1;
  uint uVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  stringformatter local_140;
  string msg;
  
  iVar3 = DAT_00193cec;
  iVar5 = gamemode;
  if (timeused < 0x1f5) {
    pcVar6 = colorname(ci);
    out(3,"\f0%s \f7scored a \f6MEGARUN!",pcVar6);
    return;
  }
  if (serverflagruns != 0) {
    lVar8 = (long)DAT_00193cec;
    lVar9 = lVar8;
    puVar10 = _flagruns;
    if (0 < lVar8) {
      do {
        if ((*(int *)(puVar10 + 1) == iVar5) &&
           (iVar4 = strcmp((char *)*puVar10,&smapname), iVar4 == 0)) {
          if (*(int *)(puVar10 + 3) < timeused) {
            local_140.buf = msg;
            pcVar6 = colorname(ci);
            uVar1 = *(int *)(puVar10 + 3) / 1000;
            stringformatter::operator()
                      (&local_140,
                       "\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best: \f0%s \f7%i.%02i\f7)"
                       ,pcVar6,(ulong)(uint)timeused / 1000,(ulong)(((uint)timeused % 1000) / 10),
                       puVar10[2],(ulong)uVar1,
                       (ulong)(uint)((int)(short)((short)*(int *)(puVar10 + 3) +
                                                 (short)uVar1 * -1000) / 10));
            goto LAB_00134fbf;
          }
          pcVar6 = (char *)puVar10[2];
          goto LAB_00134f06;
        }
        lVar9 = lVar9 + -1;
        puVar10 = puVar10 + 4;
      } while (lVar9 != 0);
      if (0x3ff < iVar3) {
        return;
      }
    }
    vector<server::_flagrun>::add((vector<server::_flagrun> *)&_flagruns);
    sVar7 = strlen(&smapname);
    pcVar6 = (char *)operator_new__(sVar7 + 1);
    strncpy(pcVar6,&smapname,sVar7 + 1);
    pcVar6[sVar7] = '\0';
    puVar2 = _flagruns;
    puVar10 = _flagruns + lVar8 * 4;
    _flagruns[lVar8 * 4] = pcVar6;
    *(int *)(puVar2 + lVar8 * 4 + 1) = gamemode;
    sVar7 = strlen(ci->name);
    pcVar6 = (char *)operator_new__(sVar7 + 1);
    strncpy(pcVar6,ci->name,sVar7 + 1);
    pcVar6[sVar7] = '\0';
    puVar2[lVar8 * 4 + 2] = pcVar6;
    *(int *)(puVar2 + lVar8 * 4 + 3) = timeused;
LAB_00134f06:
    _newflagrun = 1;
    __s1 = ci->name;
    iVar5 = strcmp(__s1,pcVar6);
    if (iVar5 != 0) {
      if (pcVar6 != (char *)0x0) {
        operator_delete__(pcVar6);
        puVar10[2] = 0;
      }
      sVar7 = strlen(__s1);
      pcVar6 = (char *)operator_new__(sVar7 + 1);
      strncpy(pcVar6,__s1,sVar7 + 1);
      pcVar6[sVar7] = '\0';
      puVar10[2] = pcVar6;
    }
    *(int *)(puVar10 + 3) = timeused;
    local_140.buf = msg;
    pcVar6 = colorname(ci);
    stringformatter::operator()
              (&local_140,"\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best\f7)",pcVar6,
               (ulong)(uint)timeused / 1000,(ulong)(((uint)timeused % 1000) / 10));
LAB_00134fbf:
    sendf(-1,1,"ris",0x23,msg);
  }
  return;
}

Assistant:

void _doflagrun(clientinfo *ci, int timeused)
    {
        if(timeused <= 500)
        {
            out(ECHO_SERV, "\f0%s \f7scored a \f6MEGARUN!", colorname(ci));
            return;
        }
        if(serverflagruns)
        {
            _flagrun *fr = 0;
            loopv(_flagruns) if(_flagruns[i].gamemode == gamemode && !strcmp(_flagruns[i].map, smapname))
            { fr = &_flagruns[i]; break; }
            bool isbest = false;
            if(!fr)
            {
                isbest = true;
                int lastfr = _flagruns.length();
                if(lastfr >= 1024) return;
                _flagruns.add();
                _flagruns[lastfr].map = newstring(smapname);
                _flagruns[lastfr].gamemode = gamemode;
                _flagruns[lastfr].name = newstring(ci->name);
                _flagruns[lastfr].timeused = timeused;
                fr = &_flagruns[lastfr];
            }
            isbest = isbest || timeused <= fr->timeused;
            if(isbest)
            {
                _newflagrun = 1;
                if(strcmp(ci->name, fr->name))
                {
                    DELETEA(fr->name);
                    fr->name = newstring(ci->name);
                }
                fr->timeused = timeused;
            }
            string msg;
            if(isbest) formatstring(msg)("\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best\f7)",
                                         colorname(ci), timeused/1000, (timeused%1000)/10);
            else formatstring(msg)("\f0%s \f7scored a flagrun in \f7%i.%02i \f7seconds (\f2best: \f0%s \f7%i.%02i\f7)",
                                   colorname(ci), timeused/1000, (timeused%1000)/10, fr->name, fr->timeused/1000, (fr->timeused%1000)/10);
            sendservmsg(msg);
        }
    }